

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

string * __thiscall
CFG::findNewUnusedVariableLetter_abi_cxx11_(string *__return_storage_ptr__,CFG *this)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  string local_40;
  char local_19;
  CFG *pCStack_18;
  char newVariable;
  CFG *this_local;
  
  local_19 = 'A';
  pCStack_18 = this;
  this_local = (CFG *)__return_storage_ptr__;
  while( true ) {
    toString_abi_cxx11_(&local_40,local_19);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_58,&this->nonTerminalsV);
    bVar1 = inVector(&local_40,&local_58);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_58);
    std::__cxx11::string::~string((string *)&local_40);
    if (!bVar1) break;
    local_19 = local_19 + '\x01';
  }
  toString_abi_cxx11_(__return_storage_ptr__,local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string CFG::findNewUnusedVariableLetter() {
    char newVariable = 'A';
    while (inVector(toString(newVariable), nonTerminalsV)) { newVariable++; }
    return toString(newVariable);
}